

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O0

Quadratic * parseOptions(HighsLp *lp,ICrashOptions *options)

{
  undefined1 uVar1;
  HighsLp *in_RDX;
  Quadratic *in_RDI;
  HighsLp local_lp;
  HighsLp ilp;
  ICrashOptions *in_stack_fffffffffffff468;
  undefined7 in_stack_fffffffffffff470;
  undefined1 in_stack_fffffffffffff477;
  ICrashOptions *in_stack_fffffffffffff490;
  HighsLp *in_stack_fffffffffffff498;
  Quadratic *in_stack_fffffffffffff4a0;
  HighsLp *in_stack_fffffffffffff4e8;
  HighsLp *in_stack_fffffffffffff4f0;
  
  HighsLp::HighsLp(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  HighsLp::HighsLp(in_stack_fffffffffffff4f0);
  convertToMinimization((HighsLp *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  uVar1 = isEqualityProblem(in_RDX);
  HighsLp::HighsLp(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  ICrashOptions::ICrashOptions
            ((ICrashOptions *)CONCAT17(uVar1,in_stack_fffffffffffff470),in_stack_fffffffffffff468);
  Quadratic::Quadratic
            (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,in_stack_fffffffffffff490);
  ICrashOptions::~ICrashOptions((ICrashOptions *)0x74559e);
  HighsLp::~HighsLp((HighsLp *)CONCAT17(uVar1,in_stack_fffffffffffff470));
  HighsLp::~HighsLp((HighsLp *)CONCAT17(uVar1,in_stack_fffffffffffff470));
  HighsLp::~HighsLp((HighsLp *)CONCAT17(uVar1,in_stack_fffffffffffff470));
  return in_RDI;
}

Assistant:

Quadratic parseOptions(const HighsLp& lp, const ICrashOptions options) {
  HighsLp ilp = lp;
  HighsLp local_lp;
  // HighsStatus status;
  convertToMinimization(ilp);
  if (isEqualityProblem(ilp)) {
    if (options.dualize) {
      // status = dualizeEqualityProblem(ilp, local_lp);
      // if (status == HighsStatus::kOk) {
      //   ilp = local_lp;
      // } else {
      //   printf("Cannot dualize equality problem\n");
      // }
    }
  } else {
    // not equality problem.
    // assert(!options.breakpoints);  // remove when implementing breakpoints
    // and
    //                                // add if else.
    // status = transformIntoEqualityProblem(ilp, local_lp);
    // if (status == HighsStatus::kOk) {
    //   ilp = local_lp;
    // } else {
    //   printf("Cannot transform into equality problem\n");
    // }
    // if (options.dualize) {
    //   // Add slacks & dualize.
    //   // dualizeEqualityProblem returns a minimization equality problem.
    //   // status = dualizeEqualityProblem(ilp, local_lp);
    //   // if (status == HighsStatus::kOk) {
    //   //   ilp = local_lp;
    //   // } else {
    //   //   printf("Cannot dualize equality problem\n");
    //   // }
    // }
  }

  return Quadratic{ilp, options};
}